

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O2

void __thiscall PointBlock<3U>::print_block(PointBlock<3U> *this,ProxyWithLink *cp,bool verbose)

{
  pointer pPVar1;
  undefined7 in_register_00000011;
  size_t i;
  ulong uVar2;
  long lVar3;
  unsigned_long local_40;
  int local_34;
  
  local_40._0_4_ = (cp->super_Proxy).gid_;
  fmt::v7::print<char[23],int,diy::DynamicPoint<float,4ul>&,diy::DynamicPoint<float,4ul>&,char>
            ((char (*) [23])"[{}] Box:    {} -- {}\n",(int *)&local_40,&(this->box).min,
             &(this->box).max);
  local_40 = CONCAT44(local_40._4_4_,(cp->super_Proxy).gid_);
  fmt::v7::print<char[23],int,diy::DynamicPoint<float,4ul>&,diy::DynamicPoint<float,4ul>&,char>
            ((char (*) [23])"[{}] Bounds: {} -- {}\n",(int *)&local_40,
             (DynamicPoint<float,_4UL> *)this,&(this->bounds).max);
  if ((int)CONCAT71(in_register_00000011,verbose) == 0) {
    local_34 = (cp->super_Proxy).gid_;
    local_40 = ((long)(this->points).
                      super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->points).
                     super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    fmt::v7::print<char[17],int,unsigned_long,char>
              ((char (*) [17])"[{}] Points: {}\n",&local_34,&local_40);
  }
  else {
    lVar3 = 0;
    for (uVar2 = 0;
        pPVar1 = (this->points).
                 super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar2 < (ulong)(((long)(this->points).
                               super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0xc);
        uVar2 = uVar2 + 1) {
      fmt::v7::print<char[6],diy::Point<float,3u>&,char>
                ((char (*) [6])0x132b8c,
                 (Point<float,_3U> *)((long)(pPVar1->super_array<float,_3UL>)._M_elems + lVar3));
      lVar3 = lVar3 + 0xc;
    }
  }
  return;
}

Assistant:

void          print_block(const diy::Master::ProxyWithLink& cp,  // communication proxy
                              bool verbose)                          // amount of output
    {
        fmt::print("[{}] Box:    {} -- {}\n", cp.gid(), box.min, box.max);
        fmt::print("[{}] Bounds: {} -- {}\n", cp.gid(), bounds.min, bounds.max);

        if (verbose)
        {
            for (size_t i = 0; i < points.size(); ++i)
                fmt::print("  {}\n", points[i]);
        } else
            fmt::print("[{}] Points: {}\n", cp.gid(), points.size());
    }